

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O3

size_t jsoncons::jsonpath::escape_string<wchar_t,std::__cxx11::wstring>
                 (wchar_t *s,size_t length,
                 basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *sink)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  
  if (length == 0) {
    sVar4 = 0;
  }
  else {
    lVar3 = 0;
    sVar4 = 0;
    do {
      iVar1 = *(int *)((long)s + lVar3);
      lVar2 = 1;
      switch(iVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
        goto switchD_0041401f_caseD_b;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((iVar1 == 0x27) || (iVar1 == 0x5c)) break;
        goto switchD_0041401f_caseD_b;
      }
      std::__cxx11::wstring::push_back((wchar_t)sink);
      lVar2 = 2;
switchD_0041401f_caseD_b:
      sVar4 = sVar4 + lVar2;
      std::__cxx11::wstring::push_back((wchar_t)sink);
      lVar3 = lVar3 + 4;
    } while (length << 2 != lVar3);
  }
  return sVar4;
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }